

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

int Sbd_ManCutReduceTop(Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj,Vec_Int_t *vLutLevs,
                       Vec_Int_t *vCut,Vec_Int_t *vCutTop,int nCutSize)

{
  int iVar1;
  int v;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int local_88;
  int local_84;
  Gia_Obj_t *pObj;
  int LevStop;
  int Fan1;
  int Fan0;
  int Lit1m;
  int Lit0m;
  int Entry;
  int i;
  Vec_Int_t *vCutTop_local;
  Vec_Int_t *vCut_local;
  Vec_Int_t *vLutLevs_local;
  int iObj_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(vLutLevs,iObj);
  iVar1 = iVar1 + -2;
  Vec_IntIsOrdered(vCut);
  Lit0m = Vec_IntSize(vCutTop);
  while( true ) {
    do {
      do {
        Lit0m = Lit0m + -1;
        if (Lit0m < 0) {
          return 0;
        }
        v = Vec_IntEntry(vCutTop,Lit0m);
        pObj_00 = Gia_ManObj(p,v);
        iVar2 = Gia_ObjIsCi(pObj_00);
      } while (iVar2 != 0);
      iVar2 = Gia_ObjIsAnd(pObj_00);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                      ,0x114,
                      "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar2 = Vec_IntEntry(vLutLevs,v);
      if (iVar2 != iVar1) {
        __assert_fail("Vec_IntEntry(vLutLevs, Entry) == LevStop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                      ,0x115,
                      "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar2 = Gia_ObjFaninId0(pObj_00,v);
      iVar2 = Vec_IntEntry(vMirrors,iVar2);
      iVar3 = Gia_ObjFaninId1(pObj_00,v);
      iVar3 = Vec_IntEntry(vMirrors,iVar3);
      if (iVar2 < 0) {
        local_84 = Gia_ObjFaninId0(pObj_00,v);
      }
      else {
        local_84 = Abc_Lit2Var(iVar2);
      }
      if (iVar3 < 0) {
        local_88 = Gia_ObjFaninId1(pObj_00,v);
      }
      else {
        local_88 = Abc_Lit2Var(iVar3);
      }
      iVar2 = Vec_IntEntry(vLutLevs,local_84);
    } while ((iVar1 < iVar2) || (iVar2 = Vec_IntEntry(vLutLevs,local_88), iVar1 < iVar2));
    iVar2 = Vec_IntEntry(vLutLevs,local_84);
    if (iVar1 < iVar2) {
      __assert_fail("Vec_IntEntry(vLutLevs, Fan0) <= LevStop",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                    ,0x11c,
                    "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar2 = Vec_IntEntry(vLutLevs,local_88);
    if (iVar1 < iVar2) break;
    iVar2 = Vec_IntEntry(vLutLevs,local_84);
    if ((iVar2 != iVar1) || (iVar2 = Vec_IntEntry(vLutLevs,local_88), iVar2 != iVar1)) {
      Vec_IntRemove(vCut,v);
      if (local_84 != 0) {
        Vec_IntPushUniqueOrder(vCut,local_84);
      }
      if (local_88 != 0) {
        Vec_IntPushUniqueOrder(vCut,local_88);
      }
      return 1;
    }
  }
  __assert_fail("Vec_IntEntry(vLutLevs, Fan1) <= LevStop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                ,0x11d,
                "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
               );
}

Assistant:

int Sbd_ManCutReduceTop( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj, Vec_Int_t * vLutLevs, Vec_Int_t * vCut, Vec_Int_t * vCutTop, int nCutSize )
{
    int i, Entry, Lit0m, Lit1m, Fan0, Fan1;
    int LevStop = Vec_IntEntry(vLutLevs, iObj) - 2;
    Vec_IntIsOrdered( vCut );
    Vec_IntForEachEntryReverse( vCutTop, Entry, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Entry );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry(vLutLevs, Entry) == LevStop );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, Entry) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, Entry) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, Entry);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, Entry);
        if ( Vec_IntEntry(vLutLevs, Fan0) > LevStop || Vec_IntEntry(vLutLevs, Fan1) > LevStop )
            continue;
        assert( Vec_IntEntry(vLutLevs, Fan0) <= LevStop );
        assert( Vec_IntEntry(vLutLevs, Fan1) <= LevStop );
        if ( Vec_IntEntry(vLutLevs, Fan0) == LevStop && Vec_IntEntry(vLutLevs, Fan1) == LevStop )
            continue;
        Vec_IntRemove( vCut, Entry );
        if ( Fan0 ) Vec_IntPushUniqueOrder( vCut, Fan0 );
        if ( Fan1 ) Vec_IntPushUniqueOrder( vCut, Fan1 );
        //Sbd_ManCutIsTopo( p, vMirrors, vCut, iObj );
        return 1;
    }
    return 0;
}